

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  RtreeNode *pRVar1;
  int iVar2;
  RtreeNode *pNode_00;
  int iCell_00;
  int iVar3;
  long in_FS_OFFSET;
  int iCell;
  RtreeCell cell;
  int local_6c;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  if (pNode->pParent != (RtreeNode *)0x0) {
    iVar3 = 0x65;
    pRVar1 = pNode->pParent;
    do {
      pNode_00 = pRVar1;
      local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
      local_68.aCoord[4].i = -1;
      local_68.aCoord[5].i = -1;
      local_68.aCoord[6].i = -1;
      local_68.aCoord[7].i = -1;
      local_68.aCoord[0].i = -1;
      local_68.aCoord[1].i = -1;
      local_68.aCoord[2].i = -1;
      local_68.aCoord[3].i = -1;
      local_68.aCoord[8] = (RtreeCoord)0xffffffff;
      local_68.aCoord[9] = (RtreeCoord)0xffffffff;
      local_6c = -0x55555556;
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) {
LAB_001fa8da:
        iVar3 = 0x10b;
        goto LAB_001fa8df;
      }
      if (pNode->pParent == (RtreeNode *)0x0) {
        iCell_00 = -1;
      }
      else {
        iVar2 = nodeRowidIndex(pRtree,(RtreeNode *)pNode->pParent->zData,pNode->iNode,&local_6c);
        iCell_00 = local_6c;
        if (iVar2 != 0) goto LAB_001fa8da;
      }
      nodeGetCell(pRtree,(RtreeNode *)pNode_00->zData,iCell_00,&local_68);
      iVar2 = cellContains(pRtree,&local_68,pCell);
      if (iVar2 == 0) {
        cellUnion(pRtree,&local_68,pCell);
        nodeOverwriteCell(pRtree,pNode_00,&local_68,iCell_00);
      }
      pRVar1 = pNode_00->pParent;
      pNode = pNode_00;
    } while (pNode_00->pParent != (RtreeNode *)0x0);
    iVar3 = 0;
  }
LAB_001fa8df:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  int rc;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    cnt++;
    if( NEVER(cnt>100) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    rc = nodeParentIndex(pRtree, p, &iCell);
    if( NEVER(rc!=SQLITE_OK) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }

    p = pParent;
  }
  return SQLITE_OK;
}